

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall Piece::Piece(Piece *this)

{
  PieceSquareTableInterpolating PStack_168;
  
  this->_vptr_Piece = (_func_int **)&PTR___cxa_pure_virtual_001221b0;
  PieceSquareTableInterpolating::PieceSquareTableInterpolating(&this->m_PieceSquareTable);
  this->m_Color = false;
  this->m_PieceType = NONE;
  this->m_pOtherColor = (Piece *)0x0;
  PieceSquareTableInterpolating::PieceSquareTableInterpolating(&PStack_168,&psrtDefault,0.0);
  PieceSquareTableInterpolating::operator=(&this->m_PieceSquareTable,&PStack_168);
  PieceSquareTableInterpolating::~PieceSquareTableInterpolating(&PStack_168);
  return;
}

Assistant:

Piece()
    {
        m_Color = BLACK;
        m_PieceType = NONE;
        m_pOtherColor = NULL;
        m_PieceSquareTable = psrtDefault;
    }